

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<int> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  TestArgsBase *_test_args;
  TestArgsWrapper unfinished_tasks_test_params;
  TestSuite test;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa28;
  TestRange<unsigned_long> *in_stack_fffffffffffffa30;
  allocator *paVar1;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  undefined8 in_stack_fffffffffffffa48;
  allocator *paVar2;
  TestSuite *in_stack_fffffffffffffa50;
  allocator_type *in_stack_fffffffffffffa58;
  allocator *__a;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  iterator in_stack_fffffffffffffa68;
  size_type in_stack_fffffffffffffa70;
  TestSuite *this_01;
  allocator *args_wrapper;
  _func_int_TestArgsBase_ptr *func;
  allocator *test_name;
  TestSuite *in_stack_fffffffffffffab0;
  string local_548 [32];
  TestArgsWrapper local_528;
  undefined1 local_519 [33];
  undefined1 *local_4f8;
  undefined8 local_4f0;
  allocator local_491;
  string local_490 [40];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 *local_448;
  undefined8 local_440;
  unfinished_tasks_test_params_class *in_stack_fffffffffffffbe0;
  allocator local_3e1;
  string local_3e0 [39];
  undefined1 local_3b9 [33];
  undefined1 *local_398;
  undefined8 local_390;
  TestRange<int> *in_stack_fffffffffffffc88;
  _func_int_int *in_stack_fffffffffffffc90;
  TestRange<unsigned_long> *in_stack_fffffffffffffc98;
  TestSuite *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  TestSuite *in_stack_fffffffffffffcb0;
  allocator local_331;
  string local_330 [35];
  TestSuite local_30d;
  allocator local_2a1;
  string local_2a0 [40];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 *local_258;
  undefined8 local_250;
  allocator local_1f1;
  string local_1f0 [40];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  allocator local_141;
  string local_140 [39];
  undefined1 local_119;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68;
  int local_4;
  
  local_4 = 0;
  TestSuite::TestSuite
            (in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
             (char **)in_stack_fffffffffffffa40);
  local_68 = 1;
  test_name = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"basic test",test_name);
  local_118 = 0;
  uStack_110 = 1;
  local_108 = 4;
  local_100 = &local_118;
  local_f8 = 3;
  func = (_func_int_TestArgsBase_ptr *)&local_119;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1062a1);
  __l._M_len = in_stack_fffffffffffffa70;
  __l._M_array = in_stack_fffffffffffffa68;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa60,__l,
             in_stack_fffffffffffffa58);
  TestRange<unsigned_long>::TestRange
            (in_stack_fffffffffffffa30,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa28);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (_func_int_unsigned_long *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  TestRange<unsigned_long>::~TestRange((TestRange<unsigned_long> *)0x10630f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x106329);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  args_wrapper = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"recurring test",args_wrapper);
  local_1c8 = 0;
  uStack_1c0 = 1;
  local_1b8 = 2;
  local_1a8 = &local_1c8;
  local_1a0 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1063b9);
  __l_00._M_len = in_stack_fffffffffffffa70;
  __l_00._M_array = in_stack_fffffffffffffa68;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa60,
             __l_00,in_stack_fffffffffffffa58);
  TestRange<unsigned_long>::TestRange
            (in_stack_fffffffffffffa30,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa28);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (_func_int_unsigned_long *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  TestRange<unsigned_long>::~TestRange((TestRange<unsigned_long> *)0x106427);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x106441);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"relay test",&local_1f1);
  local_278 = 0;
  uStack_270 = 1;
  local_268 = 2;
  local_258 = &local_278;
  local_250 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1064d1);
  __l_01._M_len = in_stack_fffffffffffffa70;
  __l_01._M_array = in_stack_fffffffffffffa68;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa60,
             __l_01,in_stack_fffffffffffffa58);
  TestRange<unsigned_long>::TestRange
            (in_stack_fffffffffffffa30,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa28);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (_func_int_unsigned_long *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  TestRange<unsigned_long>::~TestRange((TestRange<unsigned_long> *)0x10653f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x106559);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"fast relay test",&local_2a1);
  local_30d.options.abortOnFailure = false;
  local_30d.options.preserveTestFiles = false;
  local_30d._3_2_ = 0;
  local_30d._5_4_ = 1;
  local_30d.cntPass._1_4_ = 2;
  local_30d._13_8_ = &local_30d.options.abortOnFailure;
  local_30d._21_8_ = 3;
  this_01 = &local_30d;
  std::allocator<int>::allocator((allocator<int> *)0x1065ef);
  __l_02._M_len = (size_type)this_01;
  __l_02._M_array = (iterator)in_stack_fffffffffffffa68;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffa60,__l_02,(allocator_type *)in_stack_fffffffffffffa58);
  TestRange<int>::TestRange((TestRange<int> *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  TestSuite::doTest<int,int(*)(int)>
            (in_stack_fffffffffffffca0,(string *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
             ,in_stack_fffffffffffffc88);
  TestRange<int>::~TestRange((TestRange<int> *)0x10665d);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffa40);
  std::allocator<int>::~allocator((allocator<int> *)0x106677);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  paVar1 = &local_331;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"reschedule one time test",paVar1);
  local_3b9._1_8_ = 0;
  local_3b9._9_8_ = 1;
  local_3b9._17_8_ = 2;
  local_398 = local_3b9 + 1;
  local_390 = 3;
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b9;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x106707);
  __l_03._M_len = (size_type)this_01;
  __l_03._M_array = (iterator)paVar1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,__l_03,in_stack_fffffffffffffa58);
  TestRange<unsigned_long>::TestRange
            (in_stack_fffffffffffffa30,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa28);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (_func_int_unsigned_long *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  TestRange<unsigned_long>::~TestRange((TestRange<unsigned_long> *)0x106775);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10678f);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  __a = &local_3e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"reschedule recurring test",__a);
  local_468 = 0;
  uStack_460 = 1;
  local_458 = 2;
  local_448 = &local_468;
  local_440 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x10681f);
  __l_04._M_len = (size_type)this_01;
  __l_04._M_array = (iterator)paVar1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,__l_04,(allocator_type *)__a);
  TestRange<unsigned_long>::TestRange
            (in_stack_fffffffffffffa30,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa28);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (_func_int_unsigned_long *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  TestRange<unsigned_long>::~TestRange((TestRange<unsigned_long> *)0x10688d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1068a7);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  paVar2 = &local_491;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"mixed test",paVar2);
  local_519._1_8_ = 0;
  local_519._9_8_ = 1;
  local_519._17_8_ = 4;
  local_4f8 = local_519 + 1;
  local_4f0 = 3;
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_519;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x106937);
  __l_05._M_len = (size_type)this_01;
  __l_05._M_array = (iterator)paVar1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,__l_05,(allocator_type *)__a);
  TestRange<unsigned_long>::TestRange
            (in_stack_fffffffffffffa30,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa28);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (_func_int_unsigned_long *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  TestRange<unsigned_long>::~TestRange((TestRange<unsigned_long> *)0x1069a5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1069bf);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  _test_args = (TestArgsBase *)operator_new(0xe0);
  unfinished_tasks_test_params_class::unfinished_tasks_test_params_class(in_stack_fffffffffffffbe0);
  TestArgsWrapper::TestArgsWrapper(&local_528,_test_args);
  paVar1 = (allocator *)&stack0xfffffffffffffab7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"unfinished tasks test",paVar1);
  TestSuite::doTest<int(*)(TestArgsBase*)>
            (in_stack_fffffffffffffab0,(string *)test_name,func,(TestArgsWrapper *)args_wrapper);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffab7);
  local_4 = 0;
  TestArgsWrapper::~TestArgsWrapper((TestArgsWrapper *)paVar1);
  TestSuite::~TestSuite(this_01);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite test(argc, argv);
    test.options.printTestMessage = true;

    test.doTest( "basic test",
                 basic_test,
                 TestRange<size_t>( {0, 1, 4} ) );

    test.doTest( "recurring test",
                 recurring_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "relay test",
                 relay_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "fast relay test",
                 fast_relay_test,
                 TestRange<int>( {0, 1, 2} ) );

    test.doTest( "reschedule one time test",
                 reschedule_one_time_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "reschedule recurring test",
                 reschedule_recurring_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "mixed test",
                 mixed_test,
                 TestRange<size_t>( {0, 1, 4} ) );

    SET_PARAMS(unfinished_tasks_test_params);
    test.doTest( "unfinished tasks test",
                 unfinished_tasks_test,
                 unfinished_tasks_test_params );

    return 0;
}